

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

Gia_Man_t *
Gia_ManBmcUnroll(Gia_Man_t *pGia,int nFramesMax,int nFramesAdd,int fVerbose,Vec_Int_t **pvPiMap)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void **__ptr;
  void *pvVar4;
  undefined8 uVar5;
  char *__s;
  Vec_Int_t *vNodes;
  int *piVar6;
  Vec_Int_t *vLeaves;
  Vec_Ptr_t *__ptr_00;
  Vec_Int_t *pVVar7;
  void *__s_00;
  Vec_Int_t *pVVar8;
  Gia_Man_t *p;
  size_t sVar9;
  char *__dest;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint *pState;
  bool bVar20;
  int iFirst;
  uint *local_88;
  int local_34;
  
  Gia_ManCleanPhase(pGia);
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vNodes->pArray = piVar6;
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 1000;
  vLeaves->nSize = 0;
  piVar6 = (int *)malloc(4000);
  vLeaves->pArray = piVar6;
  __ptr_00 = Bmc_MnaTernary(pGia,nFramesMax,nFramesAdd,fVerbose,&local_34);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar7->pArray = piVar6;
  *pvPiMap = pVVar7;
  uVar1 = __ptr_00->nSize;
  lVar15 = (long)(int)uVar1;
  uVar18 = 8;
  if (6 < uVar1 - 1) {
    uVar18 = uVar1;
  }
  if (uVar18 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)(int)uVar18 << 3);
  }
  memset(__s_00,0,lVar15 * 8);
  uVar18 = uVar1;
  do {
    if ((int)uVar18 < 1) {
      __assert_fail("f >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcAnd.c"
                    ,0x143,"Gia_Man_t *Gia_ManBmcUnroll(Gia_Man_t *, int, int, int, Vec_Int_t **)");
    }
    uVar19 = uVar18 - 1;
    __ptr = __ptr_00->pArray;
    pvVar4 = __ptr[uVar19];
    if (uVar19 == 0) {
      local_88 = (uint *)0x0;
    }
    else {
      if ((int)uVar1 <= (int)(uVar18 - 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      local_88 = (uint *)__ptr[uVar18 - 2];
    }
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 100;
    pVVar8->nSize = 0;
    piVar6 = (int *)malloc(400);
    pVVar8->pArray = piVar6;
    pVVar7 = pGia->vCos;
    uVar13 = (ulong)(uint)pVVar7->nSize;
    if (pGia->nRegs < pVVar7->nSize) {
      lVar16 = 0;
      do {
        if ((int)uVar13 <= lVar16) goto LAB_00564e0e;
        iVar2 = pVVar7->pArray[lVar16];
        if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_00564def;
        if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
        uVar5 = *(undefined8 *)(pGia->pObjs + iVar2);
        if (-1 < (int)uVar5) {
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
        if ((~(*(uint *)((long)pvVar4 + (ulong)(((uint)((ulong)uVar5 >> 0x20) & 0x1ffffff0) >> 2))
              >> ((char)((ulong)uVar5 >> 0x20) * '\x02' & 0x1fU)) & 3) == 0) {
          if (pGia->nObjs <= iVar2) goto LAB_00564e4c;
          Vec_IntPush(pVVar8,iVar2);
        }
        lVar16 = lVar16 + 1;
        pVVar7 = pGia->vCos;
        uVar13 = (ulong)pVVar7->nSize;
      } while (lVar16 < (long)(uVar13 - (long)pGia->nRegs));
    }
    if (0 < vLeaves->nSize) {
      lVar16 = 0;
      do {
        Vec_IntPush(pVVar8,vLeaves->pArray[lVar16]);
        lVar16 = lVar16 + 1;
      } while (lVar16 < vLeaves->nSize);
    }
    *(Vec_Int_t **)((long)__s_00 + (ulong)uVar19 * 8) = pVVar8;
    Bmc_MnaCollect(pGia,pVVar8,vNodes,local_88);
    Bmc_MnaSelect(pGia,pVVar8,vNodes,vLeaves);
    if (fVerbose != 0) {
      printf("Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n",(ulong)uVar19,
             (ulong)(uint)pVVar8->nSize,(ulong)(uint)vLeaves->nSize);
    }
    uVar18 = uVar19;
  } while (vLeaves->nSize != 0);
  iVar2 = pGia->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar12 = iVar2;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar12;
  if (iVar12 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar7->pArray = piVar6;
  pVVar7->nSize = iVar2;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0xff,(long)iVar2 << 2);
  }
  p = Gia_ManStart(10000);
  __s = pGia->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar9 = strlen(__s);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  Gia_ManHashStart(p);
  if (0 < (int)uVar1) {
    lVar16 = 0;
    do {
      pVVar8 = *(Vec_Int_t **)((long)__s_00 + lVar16 * 8);
      if (pVVar8 == (Vec_Int_t *)0x0) {
        pVVar8 = pGia->vCos;
        uVar13 = (ulong)(uint)pVVar8->nSize;
        if (pGia->nRegs < pVVar8->nSize) {
          lVar14 = 0;
          do {
            if ((int)uVar13 <= lVar14) goto LAB_00564e0e;
            if ((pVVar8->pArray[lVar14] < 0) || (pGia->nObjs <= pVVar8->pArray[lVar14]))
            goto LAB_00564def;
            if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
            Gia_ManAppendCo(p,0);
            lVar14 = lVar14 + 1;
            pVVar8 = pGia->vCos;
            uVar13 = (ulong)pVVar8->nSize;
          } while (lVar14 < (long)(uVar13 - (long)pGia->nRegs));
        }
      }
      else {
        if (lVar16 == 0) {
          pState = (uint *)0x0;
        }
        else {
          pState = (uint *)__ptr[lVar16 + -1];
        }
        pVVar10 = pGia->vCos;
        uVar13 = (ulong)(uint)pVVar10->nSize;
        if (pGia->nRegs < pVVar10->nSize) {
          lVar14 = 0;
          do {
            if ((int)uVar13 <= lVar14) goto LAB_00564e0e;
            iVar2 = pVVar10->pArray[lVar14];
            if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_00564def;
            if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
            if (pVVar7->nSize <= iVar2) goto LAB_00564e6b;
            pVVar7->pArray[iVar2] = 0;
            lVar14 = lVar14 + 1;
            uVar13 = (ulong)pVVar10->nSize;
          } while (lVar14 < (long)(uVar13 - (long)pGia->nRegs));
        }
        Vec_IntPush(*pvPiMap,~(uint)lVar16);
        Bmc_MnaCollect(pGia,pVVar8,vNodes,pState);
        Bmc_MnaBuild(pGia,pVVar8,vNodes,p,pVVar7,*pvPiMap);
        if (fVerbose != 0) {
          printf("Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n",lVar16,
                 (ulong)(uint)pVVar8->nSize,(ulong)(uint)vLeaves->nSize,(ulong)(uint)vNodes->nSize);
        }
        pVVar10 = pGia->vCos;
        uVar13 = (ulong)(uint)pVVar10->nSize;
        if (pGia->nRegs < pVVar10->nSize) {
          lVar14 = 0;
          do {
            if ((int)uVar13 <= lVar14) goto LAB_00564e0e;
            iVar2 = pVVar10->pArray[lVar14];
            if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_00564def;
            if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
            if (pVVar7->nSize <= iVar2) goto LAB_00564e0e;
            Gia_ManAppendCo(p,pVVar7->pArray[iVar2]);
            lVar14 = lVar14 + 1;
            pVVar10 = pGia->vCos;
            uVar13 = (ulong)pVVar10->nSize;
          } while (lVar14 < (long)(uVar13 - (long)pGia->nRegs));
        }
        if (0 < pVVar8->nSize) {
          piVar6 = pVVar8->pArray;
          lVar14 = 0;
LAB_00564b94:
          iVar2 = piVar6[lVar14];
          lVar17 = (long)iVar2;
          if ((lVar17 < 0) || (iVar12 = pGia->nObjs, iVar12 <= iVar2)) goto LAB_00564def;
          if (pGia->pObjs != (Gia_Obj_t *)0x0) goto code_r0x00564bba;
        }
      }
LAB_00564ca4:
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar15);
  }
  Gia_ManHashStop(p);
  if (0 < (int)uVar1) {
    lVar16 = 0;
    do {
      pvVar4 = *(void **)((long)__s_00 + lVar16 * 8);
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
          *(undefined8 *)((long)pvVar4 + 8) = 0;
        }
        free(pvVar4);
      }
      lVar16 = lVar16 + 1;
    } while (lVar15 != lVar16);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    if (0 < (int)uVar1) {
      lVar16 = 0;
      do {
        if ((void *)0x2 < __ptr[lVar16]) {
          free(__ptr[lVar16]);
        }
        lVar16 = lVar16 + 1;
      } while (lVar15 != lVar16);
    }
    if (__ptr != (void **)0x0) {
      free(__ptr);
      __ptr_00->pArray = (void **)0x0;
    }
    free(__ptr_00);
  }
  if (vLeaves->pArray != (int *)0x0) {
    free(vLeaves->pArray);
    vLeaves->pArray = (int *)0x0;
  }
  free(vLeaves);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (int *)0x0;
  }
  free(vNodes);
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  free(pVVar7);
  pGVar11 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar11;
code_r0x00564bba:
  uVar5 = *(undefined8 *)(pGia->pObjs + lVar17);
  uVar18 = (uint)uVar5;
  bVar20 = (~uVar18 & 0x1fffffff) == 0;
  if ((!bVar20 && -1 >= (int)uVar18) &&
     (uVar19 = (uint)((ulong)uVar5 >> 0x20),
     pVVar10->nSize - pGia->nRegs <= (int)(uVar19 & 0x1fffffff))) {
    if (bVar20 || -1 < (int)uVar18) {
LAB_00564e8a:
      __assert_fail("Gia_ObjIsRi(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1fe,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar19 = uVar19 & 0x1fffffff;
    if ((int)uVar19 < pVVar10->nSize - pGia->nRegs) goto LAB_00564e8a;
    iVar3 = pGia->vCis->nSize;
    uVar19 = (iVar3 - pVVar10->nSize) + uVar19;
    if (((int)uVar19 < 0) || (iVar3 <= (int)uVar19)) {
LAB_00564e0e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = pGia->vCis->pArray[uVar19];
    if (((long)iVar3 < 0) || (iVar12 <= iVar3)) {
LAB_00564def:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (iVar12 <= iVar2) {
LAB_00564e4c:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (pVVar7->nSize <= iVar2) goto LAB_00564e0e;
    if ((iVar3 < 0) || (pVVar7->nSize <= iVar3)) {
LAB_00564e6b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    pVVar7->pArray[iVar3] = pVVar7->pArray[lVar17];
  }
  lVar14 = lVar14 + 1;
  if (pVVar8->nSize <= lVar14) goto LAB_00564ca4;
  goto LAB_00564b94;
}

Assistant:

Gia_Man_t * Gia_ManBmcUnroll( Gia_Man_t * pGia, int nFramesMax, int nFramesAdd, int fVerbose, Vec_Int_t ** pvPiMap )
{
    Gia_Obj_t * pObj;
    Gia_Man_t * pNew, * pTemp;
    Vec_Ptr_t * vStates, * vBegins;
    Vec_Int_t * vRoots, * vCone, * vLeaves, * vMap;
    unsigned * pStateF, * pStateP;
    int f, i, iFirst;
    Gia_ManCleanPhase( pGia );
    vCone = Vec_IntAlloc( 1000 );
    vLeaves = Vec_IntAlloc( 1000 );
    // perform ternary simulation
    vStates = Bmc_MnaTernary( pGia, nFramesMax, nFramesAdd, fVerbose, &iFirst );
    // go backward
    *pvPiMap = Vec_IntAlloc( 1000 );
    vBegins = Vec_PtrStart( Vec_PtrSize(vStates) );
    for ( f = Vec_PtrSize(vStates) - 1; f >= 0; f-- )
    {
        // get ternary states
        pStateF = (unsigned *)Vec_PtrEntry(vStates, f);
        pStateP = f ? (unsigned *)Vec_PtrEntry(vStates, f-1) : 0;
        // collect roots of this frame
        vRoots = Vec_IntAlloc( 100 );
        Gia_ManForEachPo( pGia, pObj, i )
            if ( Gia_ManTerSimInfoGet( pStateF, Gia_ObjCioId(pObj) ) == GIA_UND )
                Vec_IntPush( vRoots, Gia_ObjId(pGia, pObj) );
        // add leaves from the previous frame
        Vec_IntAppend( vRoots, vLeaves );
        Vec_PtrWriteEntry( vBegins, f, vRoots );
        // find the cone
        Bmc_MnaCollect( pGia, vRoots, vCone, pStateP ); // computes vCone
        Bmc_MnaSelect( pGia, vRoots, vCone, vLeaves );  // computes vLeaves 
        if ( fVerbose )
        printf( "Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n", 
            f, Vec_IntSize(vRoots), Vec_IntSize(vLeaves), Vec_IntSize(vCone) );
        if ( Vec_IntSize(vLeaves) == 0 )
            break;
        // it is possible that some of the POs are still ternary... 
    }
    assert( f >= 0 );
    // go forward
    vMap = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashStart( pNew );
    for ( f = 0; f < Vec_PtrSize(vStates); f++ )
    {
        vRoots = (Vec_Int_t *)Vec_PtrEntry( vBegins, f );
        if ( vRoots == NULL )
        {
            Gia_ManForEachPo( pGia, pObj, i )
                Gia_ManAppendCo( pNew, 0 );
            continue;
        }
        // get ternary states
        pStateF = (unsigned *)Vec_PtrEntry(vStates, f);
        pStateP = f ? (unsigned *)Vec_PtrEntry(vStates, f-1) : 0;
        // clean POs
        Gia_ManForEachPo( pGia, pObj, i )
            Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pObj), 0 );
        // find the cone
        Vec_IntPush( *pvPiMap, -f-1 );
        Bmc_MnaCollect( pGia, vRoots, vCone, pStateP );   // computes vCone
        Bmc_MnaBuild( pGia, vRoots, vCone, pNew, vMap, *pvPiMap );  // computes pNew       
        if ( fVerbose )
        printf( "Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n", 
            f, Vec_IntSize(vRoots), Vec_IntSize(vLeaves), Vec_IntSize(vCone) );
        // create POs
        Gia_ManForEachPo( pGia, pObj, i )
            Gia_ManAppendCo( pNew, Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
        // set a new map
        Gia_ManForEachObjVec( vRoots, pGia, pObj, i )
            if ( Gia_ObjIsRi(pGia, pObj) )
                Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, Gia_ObjRiToRo(pGia, pObj)), Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
//            else if ( Gia_ObjIsPo(pGia, pObj) )
//                Gia_ManAppendCo( pNew, Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
//            else assert( 0 );
    }
    Gia_ManHashStop( pNew );
    Vec_VecFree( (Vec_Vec_t *)vBegins );
    Vec_PtrFreeFree( vStates );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCone );
    Vec_IntFree( vMap );
    // cleanup
//    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    return pNew;
}